

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_set.c
# Opt level: O3

_Bool adt_u32Set_remove(adt_u32Set_t *self,uint32_t val)

{
  adt_u32List_elem_t *pElem;
  
  if (self == (adt_u32Set_t *)0x0) {
    return false;
  }
  pElem = adt_u32List_iter_last(&self->list);
  if (pElem == (adt_u32List_elem_t *)0x0) {
    return false;
  }
  if (pElem->item != val) {
    if (pElem->item <= val) {
      return false;
    }
    pElem = adt_u32List_iter_first(&self->list);
    if (pElem == (adt_u32List_elem_t *)0x0) {
      return false;
    }
    while (pElem->item != val) {
      if (val < pElem->item) {
        return false;
      }
      pElem = adt_u32List_iter_next(pElem);
      if (pElem == (adt_u32List_elem_t *)0x0) {
        return false;
      }
    }
  }
  adt_u32List_erase(&self->list,pElem);
  return true;
}

Assistant:

bool adt_u32Set_remove(adt_u32Set_t *self, uint32_t val)
{
   bool retval = false;
   if (self != 0)
   {
      adt_u32List_elem_t *iter = adt_u32List_iter_last(&self->list);
      if (iter != 0)
      {
         if ( val == iter->item )
         {
            retval = true;
         }
         else if (val < iter->item)
         {
            iter = adt_u32List_iter_first(&self->list);
            while (iter != 0)
            {
               if ( val == iter->item )
               {
                  retval = true;
                  break;
               }
               else if (val < iter->item)
               {
                  break;
               }
               iter = adt_u32List_iter_next(iter);
            }
         }
      }
      if (retval == true)
      {
         adt_u32List_erase(&self->list, iter);
      }
   }
   return retval;
}